

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

Matcher<const_std::tuple<mp::CallExpr>_&> * testing::A<std::tuple<mp::CallExpr>const&>(void)

{
  MatcherInterface<const_std::tuple<mp::CallExpr>_&> *pMVar1;
  Matcher<const_std::tuple<mp::CallExpr>_&> *in_RDI;
  
  pMVar1 = (MatcherInterface<const_std::tuple<mp::CallExpr>_&> *)operator_new(8);
  (pMVar1->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_001cd2b0;
  (in_RDI->super_MatcherBase<const_std::tuple<mp::CallExpr>_&>).impl_.value_ = pMVar1;
  (in_RDI->super_MatcherBase<const_std::tuple<mp::CallExpr>_&>).impl_.link_.next_ =
       &(in_RDI->super_MatcherBase<const_std::tuple<mp::CallExpr>_&>).impl_.link_;
  (in_RDI->super_MatcherBase<const_std::tuple<mp::CallExpr>_&>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001cd278;
  return in_RDI;
}

Assistant:

inline Matcher<T> A() { return MakeMatcher(new internal::AnyMatcherImpl<T>()); }